

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O2

MatrixXd * __thiscall
mnf::Manifold::diffPseudoLog0(MatrixXd *__return_storage_ptr__,Manifold *this,ConstRefVec *x)

{
  if ((this->super_ValidManifold).flag_ != 0x677d7257) {
    puts(
        "It appears that you\'re trying to call a method from a manifold that does not exist              anymore. Possible cause: the manifold was statically created in a scope (e.g. a function) which was              left since then. For Stan: https://www.youtube.com/watch?v=Yy8MUnlT9Oo"
        );
    __assert_fail("isValid() || seeMessageAbove()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0xe1,"Eigen::MatrixXd mnf::Manifold::diffPseudoLog0(const ConstRefVec &) const");
  }
  if ((x->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_rows.m_value == this->representationDim_) {
    (*this->_vptr_Manifold[0x18])();
    return __return_storage_ptr__;
  }
  __assert_fail("x.size() == representationDim_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                ,0xe2,"Eigen::MatrixXd mnf::Manifold::diffPseudoLog0(const ConstRefVec &) const");
}

Assistant:

Point Manifold::createPoint() const
{
  mnf_assert(isValid() || seeMessageAbove());
  lock();
  return Point(*this);
}